

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O3

NotificationHandle * __thiscall
jsonrpccxx::GetHandle<std::__cxx11::string_const&>
          (NotificationHandle *__return_storage_ptr__,jsonrpccxx *this,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *f)

{
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *method;
  _Any_data local_30;
  _Manager_type local_20;
  
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_30,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)this);
  notificationHandle<std::__cxx11::string_const&>
            (__return_storage_ptr__,(jsonrpccxx *)local_30._M_pod_data,method);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

NotificationHandle GetHandle(std::function<void(ParamTypes...)> f) {
    return notificationHandle(f);
  }